

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::updateViewContainerPaletteAndOpacity(QComboBoxPrivate *this)

{
  Data *pDVar1;
  QWidget *this_00;
  qreal opacity;
  int iVar2;
  QStyle *pQVar3;
  QPalette *pQVar4;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  QMenu menu;
  QStyleOptionComboBox opt;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  QWidgetData *local_c8;
  QStyleOptionComboBox local_b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->container).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->container).wp.value != (QObject *)0x0)) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    memset(&local_b8,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&local_b8);
    (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&local_b8);
    pQVar3 = QWidget::style(this_00);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,&local_b8,this_00,0);
    if (iVar2 == 0) {
      pDVar1 = (this->container).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar5 = (QWidget *)0x0;
      }
      else {
        pQVar5 = (QWidget *)(this->container).wp.value;
      }
      pQVar4 = QWidget::palette(this_00);
      QWidget::setPalette(pQVar5,pQVar4);
      QWidget::setWindowOpacity((QWidget *)(this->container).wp.value,1.0);
    }
    else {
      local_c8 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QWidget *)0x0;
      QMenu::QMenu((QMenu *)&local_e8,(QWidget *)0x0);
      QWidget::ensurePolished((QWidget *)&local_e8);
      pDVar1 = (this->container).wp.d;
      if (pDVar1 != (Data *)0x0) {
        if (*(int *)(pDVar1 + 4) == 0) {
          pQVar5 = (QWidget *)0x0;
        }
        else {
          pQVar5 = (QWidget *)(this->container).wp.value;
        }
      }
      pQVar4 = QWidget::palette((QWidget *)&local_e8);
      QWidget::setPalette(pQVar5,pQVar4);
      pDVar1 = (this->container).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar5 = (QWidget *)0x0;
      }
      else {
        pQVar5 = (QWidget *)(this->container).wp.value;
      }
      opacity = QWidget::windowOpacity((QWidget *)&local_e8);
      QWidget::setWindowOpacity(pQVar5,opacity);
      QMenu::~QMenu((QMenu *)&local_e8);
    }
    pQVar5 = &this->lineEdit->super_QWidget;
    if (pQVar5 != (QWidget *)0x0) {
      pQVar4 = QWidget::palette(this_00);
      QWidget::setPalette(pQVar5,pQVar4);
    }
    QIcon::~QIcon(&local_b8.currentIcon);
    if (&(local_b8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_b8.currentText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::updateViewContainerPaletteAndOpacity()
{
    if (!container)
        return;
    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
#if QT_CONFIG(menu)
    if (q->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, q)) {
        QMenu menu;
        menu.ensurePolished();
        container->setPalette(menu.palette());
        container->setWindowOpacity(menu.windowOpacity());
    } else
#endif
    {
        container->setPalette(q->palette());
        container->setWindowOpacity(1.0);
    }
    if (lineEdit)
        lineEdit->setPalette(q->palette());
}